

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

int gdImageGetTrueColorPixel(gdImagePtr im,int x,int y)

{
  int local_28;
  int p;
  int y_local;
  int x_local;
  gdImagePtr im_local;
  
  im_local._4_4_ = gdImageGetPixel(im,x,y);
  if (im->trueColor == 0) {
    if (im->transparent == im_local._4_4_) {
      local_28 = 0x7f;
    }
    else {
      local_28 = im->alpha[im_local._4_4_];
    }
    im_local._4_4_ =
         local_28 * 0x1000000 + im->red[im_local._4_4_] * 0x10000 +
         im->green[im_local._4_4_] * 0x100 + im->blue[im_local._4_4_];
  }
  return im_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdImageGetTrueColorPixel (gdImagePtr im, int x, int y)
{
	int p = gdImageGetPixel (im, x, y);
	if (!im->trueColor) {
		return gdTrueColorAlpha (im->red[p], im->green[p], im->blue[p],
		                         (im->transparent == p) ? gdAlphaTransparent :
		                         im->alpha[p]);
	} else {
		return p;
	}
}